

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# music_hmi_midiout.cpp
# Opt level: O0

void __thiscall HMISong::AdvanceTracks(HMISong *this,DWORD time)

{
  int local_18;
  int i;
  DWORD time_local;
  HMISong *this_local;
  
  for (local_18 = 0; local_18 <= this->NumTracks; local_18 = local_18 + 1) {
    if (((this->Tracks[local_18].Enabled & 1U) != 0) &&
       ((this->Tracks[local_18].Finished & 1U) == 0)) {
      this->Tracks[local_18].Delay = this->Tracks[local_18].Delay - time;
      this->Tracks[local_18].PlayedTime = time + this->Tracks[local_18].PlayedTime;
    }
  }
  NoteOffQueue::AdvanceTime(&this->NoteOffs,time);
  return;
}

Assistant:

void HMISong::AdvanceTracks(DWORD time)
{
	for (int i = 0; i <= NumTracks; ++i)
	{
		if (Tracks[i].Enabled && !Tracks[i].Finished)
		{
			Tracks[i].Delay -= time;
			Tracks[i].PlayedTime += time;
		}
	}
	NoteOffs.AdvanceTime(time);
}